

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPolyhedralContactClipping.cpp
# Opt level: O3

void cbtPolyhedralContactClipping::clipHullAgainstHull
               (cbtVector3 *separatingNormal1,cbtConvexPolyhedron *hullA,cbtConvexPolyhedron *hullB,
               cbtTransform *transA,cbtTransform *transB,cbtScalar minDist,cbtScalar maxDist,
               cbtVertexArray *worldVertsB1,cbtVertexArray *worldVertsB2,Result *resultOut)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  cbtFace *pcVar5;
  undefined8 uVar6;
  uint uVar7;
  ulong uVar8;
  cbtVector3 *pcVar9;
  cbtScalar *pcVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  undefined1 auVar26 [64];
  cbtVector3 separatingNormal;
  cbtVector3 local_40;
  
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)separatingNormal1->m_floats;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(separatingNormal1->m_floats + 2);
  auVar18 = vmovshdup_avx(auVar19);
  fVar22 = auVar18._0_4_;
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * fVar22)),auVar19,auVar19);
  auVar18 = vfmadd231ss_fma(auVar18,auVar20,auVar20);
  auVar18 = vsqrtss_avx(auVar18,auVar18);
  fVar24 = 1.0 / auVar18._0_4_;
  auVar21 = ZEXT416((uint)((float)*(ulong *)separatingNormal1->m_floats * fVar24));
  auVar18 = vinsertps_avx(auVar21,ZEXT416((uint)(fVar22 * fVar24)),0x10);
  auVar23 = ZEXT416((uint)((float)*(ulong *)(separatingNormal1->m_floats + 2) * fVar24));
  auVar19 = vinsertps_avx(auVar23,auVar20,0x5c);
  local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar18,auVar19);
  uVar8 = (ulong)(hullB->m_faces).m_size;
  if ((long)uVar8 < 1) {
    iVar15 = -1;
  }
  else {
    auVar26 = ZEXT464(0xff7fffff);
    uVar16 = 0xffffffff;
    uVar12 = 0;
    pcVar10 = ((hullB->m_faces).m_data)->m_plane + 2;
    do {
      fVar25 = pcVar10[-1];
      cVar3 = pcVar10[-2];
      cVar4 = *pcVar10;
      auVar18 = vmulss_avx512f(ZEXT416((uint)fVar25),
                               ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[1]));
      auVar19 = vmulss_avx512f(ZEXT416((uint)fVar25),
                               ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[1]));
      auVar20 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[0]),
                                    ZEXT416((uint)cVar3));
      auVar19 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[0]),
                                    ZEXT416((uint)cVar3));
      auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * (transB->m_basis).m_el[2].m_floats[1])),
                                ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[0]),
                                ZEXT416((uint)cVar3));
      auVar20 = vfmadd231ss_avx512f(auVar20,ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[2]),
                                    ZEXT416((uint)cVar4));
      auVar19 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[2]),
                                    ZEXT416((uint)cVar4));
      auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[2]),
                                ZEXT416((uint)cVar4));
      auVar20 = vmulss_avx512f(auVar20,ZEXT416((uint)(fVar22 * fVar24)));
      auVar19 = vfmadd231ss_avx512f(auVar20,auVar21,auVar19);
      auVar19 = vfmadd231ss_fma(auVar19,auVar23,auVar18);
      fVar25 = auVar26._0_4_;
      auVar18 = vmaxss_avx(auVar19,auVar26._0_16_);
      auVar26 = ZEXT1664(auVar18);
      if (fVar25 < auVar19._0_4_) {
        uVar16 = uVar12 & 0xffffffff;
      }
      iVar15 = (int)uVar16;
      uVar12 = uVar12 + 1;
      pcVar10 = pcVar10 + 0xc;
    } while (uVar8 != uVar12);
  }
  if ((worldVertsB1->m_size < 0) && (worldVertsB1->m_capacity < 0)) {
    if ((worldVertsB1->m_data != (cbtVector3 *)0x0) && (worldVertsB1->m_ownsMemory == true)) {
      cbtAlignedFreeInternal(worldVertsB1->m_data);
    }
    worldVertsB1->m_ownsMemory = true;
    worldVertsB1->m_data = (cbtVector3 *)0x0;
    worldVertsB1->m_capacity = 0;
  }
  worldVertsB1->m_size = 0;
  pcVar5 = (hullB->m_faces).m_data;
  lVar13 = (long)pcVar5[iVar15].m_indices.m_size;
  if (0 < lVar13) {
    auVar26 = ZEXT1264(ZEXT812(0));
    uVar7 = 0;
    lVar14 = 0;
    do {
      pcVar9 = (hullB->m_vertices).m_data;
      iVar17 = pcVar5[iVar15].m_indices.m_data[lVar14];
      fVar22 = pcVar9[iVar17].m_floats[1];
      cVar3 = pcVar9[iVar17].m_floats[0];
      cVar4 = pcVar9[iVar17].m_floats[2];
      auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * (transB->m_basis).m_el[0].m_floats[1])),
                                ZEXT416((uint)cVar3),
                                ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[0]));
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * (transB->m_basis).m_el[1].m_floats[1])),
                                ZEXT416((uint)cVar3),
                                ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[0]));
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * (transB->m_basis).m_el[2].m_floats[1])),
                                ZEXT416((uint)cVar3),
                                ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[0]));
      auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)cVar4),
                                ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[2]));
      auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)cVar4),
                                ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[2]));
      auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar4),
                                ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[2]));
      fVar22 = (transB->m_origin).m_floats[0];
      fVar24 = (transB->m_origin).m_floats[1];
      fVar25 = (transB->m_origin).m_floats[2];
      if (uVar7 == worldVertsB1->m_capacity) {
        iVar17 = uVar7 * 2;
        if (uVar7 == 0) {
          iVar17 = 1;
        }
        if ((int)uVar7 < iVar17) {
          if (iVar17 == 0) {
            pcVar9 = (cbtVector3 *)0x0;
          }
          else {
            pcVar9 = (cbtVector3 *)cbtAlignedAllocInternal((long)iVar17 << 4,0x10);
            uVar7 = worldVertsB1->m_size;
            auVar26 = ZEXT1264(ZEXT812(0));
          }
          if (0 < (int)uVar7) {
            lVar11 = 0;
            do {
              puVar1 = (undefined8 *)((long)worldVertsB1->m_data->m_floats + lVar11);
              uVar6 = puVar1[1];
              puVar2 = (undefined8 *)((long)pcVar9->m_floats + lVar11);
              *puVar2 = *puVar1;
              puVar2[1] = uVar6;
              lVar11 = lVar11 + 0x10;
            } while ((ulong)uVar7 << 4 != lVar11);
          }
          if ((worldVertsB1->m_data != (cbtVector3 *)0x0) && (worldVertsB1->m_ownsMemory == true)) {
            cbtAlignedFreeInternal(worldVertsB1->m_data);
            auVar26 = ZEXT1264(ZEXT812(0));
          }
          worldVertsB1->m_ownsMemory = true;
          worldVertsB1->m_data = pcVar9;
          worldVertsB1->m_capacity = iVar17;
          uVar7 = worldVertsB1->m_size;
        }
      }
      auVar18 = vinsertps_avx(ZEXT416((uint)(auVar18._0_4_ + fVar22)),
                              ZEXT416((uint)(auVar19._0_4_ + fVar24)),0x10);
      auVar23._4_12_ = auVar26._4_12_;
      auVar23._0_4_ = auVar21._0_4_ + fVar25;
      lVar14 = lVar14 + 1;
      auVar18 = vmovlhps_avx(auVar18,auVar23);
      *(undefined1 (*) [16])worldVertsB1->m_data[(int)uVar7].m_floats = auVar18;
      uVar7 = worldVertsB1->m_size + 1;
      worldVertsB1->m_size = uVar7;
    } while (lVar14 != lVar13);
  }
  if (-1 < iVar15) {
    clipFaceAgainstHull(&local_40,hullA,transA,worldVertsB1,worldVertsB2,minDist,maxDist,resultOut);
  }
  return;
}

Assistant:

void cbtPolyhedralContactClipping::clipHullAgainstHull(const cbtVector3& separatingNormal1, const cbtConvexPolyhedron& hullA, const cbtConvexPolyhedron& hullB, const cbtTransform& transA, const cbtTransform& transB, const cbtScalar minDist, cbtScalar maxDist, cbtVertexArray& worldVertsB1, cbtVertexArray& worldVertsB2, cbtDiscreteCollisionDetectorInterface::Result& resultOut)
{
	cbtVector3 separatingNormal = separatingNormal1.normalized();
	//	const cbtVector3 c0 = transA * hullA.m_localCenter;
	//	const cbtVector3 c1 = transB * hullB.m_localCenter;
	//const cbtVector3 DeltaC2 = c0 - c1;

	int closestFaceB = -1;
	cbtScalar dmax = -FLT_MAX;
	{
		for (int face = 0; face < hullB.m_faces.size(); face++)
		{
			const cbtVector3 Normal(hullB.m_faces[face].m_plane[0], hullB.m_faces[face].m_plane[1], hullB.m_faces[face].m_plane[2]);
			const cbtVector3 WorldNormal = transB.getBasis() * Normal;
			cbtScalar d = WorldNormal.dot(separatingNormal);
			if (d > dmax)
			{
				dmax = d;
				closestFaceB = face;
			}
		}
	}
	worldVertsB1.resize(0);
	{
		const cbtFace& polyB = hullB.m_faces[closestFaceB];
		const int numVertices = polyB.m_indices.size();
		for (int e0 = 0; e0 < numVertices; e0++)
		{
			const cbtVector3& b = hullB.m_vertices[polyB.m_indices[e0]];
			worldVertsB1.push_back(transB * b);
		}
	}

	if (closestFaceB >= 0)
		clipFaceAgainstHull(separatingNormal, hullA, transA, worldVertsB1, worldVertsB2, minDist, maxDist, resultOut);
}